

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu2.c
# Opt level: O2

MPP_RET hal_m2vd_vdpu2_init(void *hal,MppHalCfg *cfg)

{
  undefined8 uVar1;
  undefined8 uVar2;
  MPP_RET MVar3;
  void *ptr;
  FILE *pFVar4;
  char *fmt;
  MppBufferGroup group;
  undefined1 auVar5 [16];
  
  if (((byte)m2vh_debug & 1) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x24,
               "hal_m2vd_vdpu2_init");
  }
  ptr = mpp_osal_calloc("hal_m2vd_vdpu2_init",0x27c);
  if (ptr == (void *)0x0) {
    _mpp_log_l(2,"hal_m2vd_vdpu2","failed to malloc register ret\n","hal_m2vd_vdpu2_init");
    MVar3 = MPP_ERR_MALLOC;
    if (hal == (void *)0x0) {
      return MPP_ERR_MALLOC;
    }
    goto LAB_001f0fa5;
  }
  *(undefined4 *)((long)hal + 0xa8) = 0x9f;
  MVar3 = mpp_dev_init((MppDev *)((long)hal + 0x90),VPU_CLIENT_VDPU2);
  if (MVar3 == MPP_OK) {
    group = *(MppBufferGroup *)((long)hal + 0x70);
    if (group == (MppBufferGroup)0x0) {
      MVar3 = mpp_buffer_group_get
                        ((MppBufferGroup *)((long)hal + 0x70),MPP_BUFFER_TYPE_ION,
                         MPP_BUFFER_INTERNAL,"hal_m2vd_vdpu2","hal_m2vd_vdpu2_init");
      if (MVar3 == MPP_OK) {
        group = *(MppBufferGroup *)((long)hal + 0x70);
        goto LAB_001f0f18;
      }
      fmt = "m2v_hal mpp_buffer_group_get failed\n";
    }
    else {
LAB_001f0f18:
      MVar3 = mpp_buffer_get_with_tag
                        (group,(MppBuffer *)((long)hal + 0x78),0x100,"hal_m2vd_vdpu2",
                         "hal_m2vd_vdpu2_init");
      if (MVar3 == MPP_OK) {
        if (((byte)m2vh_debug & 4) == 0) {
          *(undefined8 *)((long)hal + 0x98) = 0;
          *(undefined8 *)((long)hal + 0xa0) = 0;
        }
        else {
          pFVar4 = fopen("/sdcard/m2vd_dbg_reg_in.txt","wb");
          *(FILE **)((long)hal + 0x98) = pFVar4;
          if (pFVar4 == (FILE *)0x0) {
            _mpp_log_l(4,"hal_m2vd_vdpu2","file open error: %s",(char *)0x0,
                       "/sdcard/m2vd_dbg_reg_in.txt");
          }
          pFVar4 = fopen("/sdcard/m2vd_dbg_reg_out.txt","wb");
          *(FILE **)((long)hal + 0xa0) = pFVar4;
          if (pFVar4 == (FILE *)0x0) {
            _mpp_log_l(4,"hal_m2vd_vdpu2","file open error: %s",(char *)0x0,
                       "/sdcard/m2vd_dbg_reg_out.txt");
          }
        }
        uVar1 = cfg->frame_slots;
        uVar2 = cfg->packet_slots;
        auVar5._8_4_ = (int)uVar1;
        auVar5._0_8_ = uVar2;
        auVar5._12_4_ = (int)((ulong)uVar1 >> 0x20);
        *(undefined1 (*) [16])((long)hal + 0x58) = auVar5;
        *(MppCbCtx **)((long)hal + 0x88) = cfg->dec_cb;
        *(void **)((long)hal + 0x68) = ptr;
        cfg->dev = *(MppDev *)((long)hal + 0x90);
        if (((byte)m2vh_debug & 1) == 0) {
          return MPP_OK;
        }
        _mpp_log_l(4,"hal_m2vd_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x58,
                   "hal_m2vd_vdpu2_init");
        return MPP_OK;
      }
      fmt = "m2v_hal qtable_base get buffer failed\n";
    }
    _mpp_log_l(2,"hal_m2vd_vdpu2",fmt,(char *)0x0);
  }
  else {
    _mpp_log_l(2,"hal_m2vd_vdpu2","mpp_dev_init failed. ret: %d\n","hal_m2vd_vdpu2_init",
               (ulong)(uint)MVar3);
  }
  mpp_osal_free("hal_m2vd_vdpu2_init",ptr);
LAB_001f0fa5:
  hal_m2vd_vdpu2_deinit(hal);
  return MVar3;
}

Assistant:

MPP_RET hal_m2vd_vdpu2_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *p = (M2vdHalCtx *)hal;
    M2vdVdpu2Reg *reg = NULL;

    m2vh_dbg_func("enter\n");

    reg = mpp_calloc(M2vdVdpu2Reg, 1);
    if (NULL == reg) {
        mpp_err_f("failed to malloc register ret\n");
        ret = MPP_ERR_MALLOC;
        goto __ERR_RET;
    }

    p->reg_len = M2VD_VDPU2_REG_NUM;

    ret = mpp_dev_init(&p->dev, VPU_CLIENT_VDPU2);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto __ERR_RET;
    }

    if (p->group == NULL) {
        ret = mpp_buffer_group_get_internal(&p->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("m2v_hal mpp_buffer_group_get failed\n");
            goto __ERR_RET;
        }
    }

    ret = mpp_buffer_get(p->group, &p->qp_table, M2VD_BUF_SIZE_QPTAB);
    if (ret) {
        mpp_err("m2v_hal qtable_base get buffer failed\n");
        goto __ERR_RET;
    }

    if (M2VH_DBG_DUMP_REG & m2vh_debug) {
        p->fp_reg_in = fopen("/sdcard/m2vd_dbg_reg_in.txt", "wb");
        if (p->fp_reg_in == NULL) {
            mpp_log("file open error: %s", "/sdcard/m2vd_dbg_reg_in.txt");
        }
        p->fp_reg_out = fopen("/sdcard/m2vd_dbg_reg_out.txt", "wb");
        if (p->fp_reg_out == NULL) {
            mpp_log("file open error: %s", "/sdcard/m2vd_dbg_reg_out.txt");
        }
    } else {
        p->fp_reg_in = NULL;
        p->fp_reg_out = NULL;
    }

    //configure
    p->packet_slots = cfg->packet_slots;
    p->frame_slots  = cfg->frame_slots;
    p->dec_cb       = cfg->dec_cb;
    p->regs         = (void*)reg;
    cfg->dev        = p->dev;

    m2vh_dbg_func("leave\n");

    return ret;

__ERR_RET:
    if (reg) {
        mpp_free(reg);
        reg = NULL;
    }

    if (p) {
        hal_m2vd_vdpu2_deinit(p);
    }

    return ret;
}